

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::WriteChannelInfo
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *data,
               vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *channels)

{
  size_type sVar1;
  char *pcVar2;
  size_t sVar3;
  void *__src;
  const_reference pvVar4;
  vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *in_RSI;
  int y_sampling;
  int x_sampling;
  int pixel_type;
  size_t c_1;
  uchar *p;
  size_t c;
  size_t sz;
  size_type in_stack_ffffffffffffff98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffa0;
  uint *__dest;
  ulong uVar5;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint uVar6;
  uint local_38;
  uint local_34;
  ulong local_30;
  uint *local_28;
  ulong local_20;
  long local_18;
  vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *local_10;
  
  local_18 = 0;
  local_20 = 0;
  local_10 = in_RSI;
  while( true ) {
    uVar5 = local_20;
    sVar1 = std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::size(local_10)
    ;
    if (sVar1 <= uVar5) break;
    std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::operator[]
              (local_10,local_20);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    sVar3 = strlen(pcVar2);
    local_18 = sVar3 + local_18 + 0x11;
    local_20 = local_20 + 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),uVar5);
  local_28 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_30 = 0;
  while( true ) {
    uVar5 = local_30;
    sVar1 = std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::size(local_10)
    ;
    if (sVar1 <= uVar5) break;
    __dest = local_28;
    std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::operator[]
              (local_10,local_30);
    __src = (void *)std::__cxx11::string::c_str();
    std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::operator[]
              (local_10,local_30);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    sVar3 = strlen(pcVar2);
    memcpy(__dest,__src,sVar3);
    std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::operator[]
              (local_10,local_30);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    sVar3 = strlen(pcVar2);
    *(reference)(sVar3 + (long)local_28) = '\0';
    local_28 = (uint *)((reference)(sVar3 + (long)local_28) + 1);
    pvVar4 = std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::operator[]
                       (local_10,local_30);
    local_34 = pvVar4->pixel_type;
    pvVar4 = std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::operator[]
                       (local_10,local_30);
    local_38 = pvVar4->x_sampling;
    pvVar4 = std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::operator[]
                       (local_10,local_30);
    uVar6 = pvVar4->y_sampling;
    swap4(&local_34);
    swap4(&local_38);
    swap4((uint *)&stack0xffffffffffffffc4);
    *local_28 = local_34;
    local_28 = local_28 + 1;
    pvVar4 = std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::operator[]
                       (local_10,local_30);
    *(uchar *)local_28 = pvVar4->p_linear;
    local_28[1] = local_38;
    local_28[2] = uVar6;
    local_28 = local_28 + 3;
    local_30 = local_30 + 1;
  }
  *(value_type *)local_28 = '\0';
  return;
}

Assistant:

static void WriteChannelInfo(std::vector<unsigned char> &data,
                             const std::vector<ChannelInfo> &channels) {
  size_t sz = 0;

  // Calculate total size.
  for (size_t c = 0; c < channels.size(); c++) {
    sz += strlen(channels[c].name.c_str()) + 1;  // +1 for \0
    sz += 16;                                    // 4 * int
  }
  data.resize(sz + 1);

  unsigned char *p = &data.at(0);

  for (size_t c = 0; c < channels.size(); c++) {
    memcpy(p, channels[c].name.c_str(), strlen(channels[c].name.c_str()));
    p += strlen(channels[c].name.c_str());
    (*p) = '\0';
    p++;

    int pixel_type = channels[c].pixel_type;
    int x_sampling = channels[c].x_sampling;
    int y_sampling = channels[c].y_sampling;
    tinyexr::swap4(reinterpret_cast<unsigned int *>(&pixel_type));
    tinyexr::swap4(reinterpret_cast<unsigned int *>(&x_sampling));
    tinyexr::swap4(reinterpret_cast<unsigned int *>(&y_sampling));

    memcpy(p, &pixel_type, sizeof(int));
    p += sizeof(int);

    (*p) = channels[c].p_linear;
    p += 4;

    memcpy(p, &x_sampling, sizeof(int));
    p += sizeof(int);

    memcpy(p, &y_sampling, sizeof(int));
    p += sizeof(int);
  }

  (*p) = '\0';
}